

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

bool __thiscall QTreeWidgetItem::isExpanded(QTreeWidgetItem *this)

{
  bool bVar1;
  QTreeView *this_00;
  bool bVar2;
  QTreeModel *pQVar3;
  char *__s;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_30;
  
  local_30 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  pQVar3 = treeModel(this,(QTreeWidget *)0x0);
  if (pQVar3 != (QTreeModel *)0x0) {
    bVar1 = pQVar3->skipPendingSort;
    pQVar3->skipPendingSort = true;
    this_00 = &this->view->super_QTreeView;
    __s = (char *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
    QTreeModel::index((QTreeModel *)&stack0xffffffffffffffb8,__s,(int)this);
    bVar2 = QTreeView::isExpanded(this_00,(QModelIndex *)&stack0xffffffffffffffb8);
    pQVar3->skipPendingSort = bVar1;
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeWidgetItem::isExpanded() const
{
    const QTreeModel *model = treeModel();
    if (!model)
        return false;
    QTreeModel::SkipSorting skipSorting(model);
    return view->isExpanded(view->d_func()->index(this));
}